

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CSubNet::Match(CSubNet *this,CNetAddr *addr)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  byte *pbVar7;
  long in_RSI;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  size_t x;
  CNetAddr *in_stack_ffffffffffffffc0;
  ulong uVar8;
  undefined4 in_stack_ffffffffffffffc8;
  Network NVar9;
  ulong local_28;
  bool local_9;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_RDI[1].m_addr._size & 1) == 0) || (bVar4 = CNetAddr::IsValid(in_RDI), !bVar4)) ||
     (in_RDI->m_net != *(Network *)(in_RSI + 0x18))) {
    local_9 = false;
    goto LAB_019814b9;
  }
  NVar9 = in_RDI->m_net;
  if (NVar9 == NET_UNROUTABLE) {
LAB_019813e0:
    local_9 = false;
  }
  else {
    if (1 < NVar9 - NET_IPV4) {
      if (NVar9 - NET_ONION < 4) {
        local_9 = ::operator==((CNetAddr *)CONCAT44(NVar9,in_stack_ffffffffffffffc8),
                               in_stack_ffffffffffffffc0);
        goto LAB_019814b9;
      }
      if (NVar9 == NET_MAX) goto LAB_019813e0;
    }
    sVar5 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT44(NVar9,in_stack_ffffffffffffffc8));
    sVar6 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)CONCAT44(NVar9,sVar5));
    if (sVar5 != sVar6) {
      __assert_fail("network.m_addr.size() == addr.m_addr.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netaddress.cpp"
                    ,0x410,"bool CSubNet::Match(const CNetAddr &) const");
    }
    local_28 = 0;
    while (uVar8 = local_28,
          sVar6 = prevector<16U,_unsigned_char,_unsigned_int,_int>::size
                            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                             CONCAT44(NVar9,sVar5)), uVar8 < sVar6) {
      pbVar7 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)CONCAT44(NVar9,sVar5),
                          (size_type)(uVar8 >> 0x20));
      bVar1 = *pbVar7;
      bVar2 = in_RDI[1].m_addr._union.direct[local_28];
      pbVar7 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)CONCAT44(NVar9,sVar5),
                          (size_type)(uVar8 >> 0x20));
      if ((bVar1 & bVar2) != *pbVar7) {
        local_9 = false;
        goto LAB_019814b9;
      }
      local_28 = local_28 + 1;
    }
    local_9 = true;
  }
LAB_019814b9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool CSubNet::Match(const CNetAddr &addr) const
{
    if (!valid || !addr.IsValid() || network.m_net != addr.m_net)
        return false;

    switch (network.m_net) {
    case NET_IPV4:
    case NET_IPV6:
        break;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
    case NET_INTERNAL:
        return addr == network;
    case NET_UNROUTABLE:
    case NET_MAX:
        return false;
    }

    assert(network.m_addr.size() == addr.m_addr.size());
    for (size_t x = 0; x < addr.m_addr.size(); ++x) {
        if ((addr.m_addr[x] & netmask[x]) != network.m_addr[x]) {
            return false;
        }
    }
    return true;
}